

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void JoinGame(int i)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int i_local;
  
  iVar1 = DArgs::NumArgs(Args);
  if (i != iVar1 + -1) {
    pcVar3 = DArgs::GetArg(Args,i + 1);
    if (*pcVar3 != '-') {
      pcVar3 = DArgs::GetArg(Args,i + 1);
      if (*pcVar3 != '+') goto LAB_005e3d14;
    }
  }
  I_FatalError("You need to specify the host machine\'s address");
LAB_005e3d14:
  StartNetwork(true);
  pcVar3 = DArgs::GetArg(Args,i + 1);
  BuildAddress(sendaddress + 1,pcVar3);
  sendplayer[1] = '\0';
  doomcom.numnodes = 2;
  addterm(SendAbort,"SendAbort");
  (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Contacting host",0);
  uVar2 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Guest_ContactHost,0);
  if ((uVar2 & 1) == 0) {
    exit(0);
  }
  uVar2 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Guest_WaitForOthers,0);
  if ((uVar2 & 1) == 0) {
    exit(0);
  }
  popterm();
  (*StartScreen->_vptr_FStartupScreen[7])
            (StartScreen,"Total players: %d",(ulong)(uint)(int)doomcom.numnodes);
  doomcom.id = 0x12345678;
  doomcom.numplayers = doomcom.numnodes;
  return;
}

Assistant:

void JoinGame (int i)
{
	if ((i == Args->NumArgs() - 1) ||
		(Args->GetArg(i+1)[0] == '-') ||
		(Args->GetArg(i+1)[0] == '+'))
		I_FatalError ("You need to specify the host machine's address");

	StartNetwork (true);

	// Host is always node 1
	BuildAddress (&sendaddress[1], Args->GetArg(i+1));
	sendplayer[1] = 0;
	doomcom.numnodes = 2;

	atterm (SendAbort);

	// Let host know we are here
	StartScreen->NetInit ("Contacting host", 0);

	if (!StartScreen->NetLoop (Guest_ContactHost, NULL))
	{
		exit (0);
	}

	// Wait for everyone else to connect
	if (!StartScreen->NetLoop (Guest_WaitForOthers, 0))
	{
		exit (0);
	}

	popterm ();

	StartScreen->NetMessage ("Total players: %d", doomcom.numnodes);

	doomcom.id = DOOMCOM_ID;
	doomcom.numplayers = doomcom.numnodes;
}